

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall ThreadData::runInThread(ThreadData *this)

{
  bool bVar1;
  int iVar2;
  function<void_()> *in_RDI;
  long *in_FS_OFFSET;
  CountDownLatch *unaff_retaddr;
  char *local_18;
  
  iVar2 = CurrentThread::tid();
  **(int **)&in_RDI[2].super__Function_base._M_functor = iVar2;
  *(undefined8 *)&in_RDI[2].super__Function_base._M_functor = 0;
  CountDownLatch::countDown(unaff_retaddr);
  *(undefined8 *)((long)&in_RDI[2].super__Function_base._M_functor + 8) = 0;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x121b5c);
  if (bVar1) {
    local_18 = "Thread";
  }
  else {
    local_18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x121b7d);
  }
  *(char **)(*in_FS_OFFSET + -0x48) = local_18;
  prctl(0xf,*(undefined8 *)(*in_FS_OFFSET + -0x48));
  std::function<void_()>::operator()(in_RDI);
  *(char **)(*in_FS_OFFSET + -0x48) = "finished";
  return;
}

Assistant:

void runInThread(){
        *tid_=CurrentThread::tid();
        tid_=nullptr;
        latch_->countDown();
        latch_=nullptr;

        CurrentThread::t_threadName = name_.empty()?"Thread":name_.c_str();
        prctl(PR_SET_NAME, CurrentThread::t_threadName);

        func_();
        CurrentThread::t_threadName = "finished";
    }